

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O0

void __thiscall Threadpool::Threadpool(Threadpool *this,unsigned_short size)

{
  unsigned_short size_local;
  Threadpool *this_local;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->tp_pool);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->tp_tasks);
  std::mutex::mutex(&this->tp_lock);
  std::condition_variable::condition_variable(&this->tp_task_cv);
  std::atomic<bool>::atomic(&this->tp_run,true);
  std::atomic<int>::atomic(&this->tp_idl_tnum,0);
  if (size < 0x41) {
    add_thread(this,size);
    return;
  }
  __assert_fail("size <= THREADPOOL_MAX_NUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/../threadpool/threadpool.h"
                ,0x19,"Threadpool::Threadpool(unsigned short)");
}

Assistant:

inline Threadpool(unsigned short size = 4) { 
        assert(size <= THREADPOOL_MAX_NUM);
        add_thread(size); 
    }